

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_9.c
# Opt level: O2

int * aom_fast9_score(byte *i,int stride,xy *corners,int num_corners,int b)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  int pixel [16];
  
  piVar5 = (int *)malloc((long)num_corners << 2);
  if (piVar5 != (int *)0x0) {
    make_offsets(pixel,stride);
    lVar29 = (long)pixel[7];
    lVar30 = (long)pixel[8];
    lVar31 = (long)pixel[9];
    lVar6 = (long)pixel[6];
    lVar7 = (long)pixel[10];
    lVar8 = (long)pixel[0xb];
    lVar9 = (long)pixel[0xc];
    lVar10 = (long)pixel[0xd];
    lVar11 = (long)pixel[0xe];
    lVar12 = (long)pixel[0xf];
    lVar13 = (long)pixel[5];
    lVar14 = (long)pixel[4];
    lVar15 = (long)pixel[3];
    lVar16 = (long)pixel[2];
    lVar33 = (long)pixel[1];
    uVar32 = 0;
    uVar26 = (ulong)(uint)num_corners;
    if (num_corners < 1) {
      uVar26 = uVar32;
    }
    for (; uVar32 != uVar26; uVar32 = uVar32 + 1) {
      lVar24 = (long)stride * (long)corners[uVar32].y;
      lVar2 = corners[uVar32].x + lVar24;
      iVar3 = b + 0xff;
      iVar27 = 0xff;
      iVar25 = b;
      do {
        iVar3 = iVar3 / 2;
        uVar22 = (uint)i[corners[uVar32].x + lVar24] - iVar3;
        uVar4 = iVar3 + (uint)i[corners[uVar32].x + lVar24];
        lVar18 = lVar9;
        lVar21 = lVar11;
        lVar20 = lVar7;
        iVar28 = iVar3;
        if ((int)uVar4 < (int)(uint)i[pixel[0] + lVar2]) {
          if ((int)uVar4 < (int)(uint)i[lVar33 + lVar2]) {
            lVar19 = lVar10;
            lVar17 = lVar8;
            if ((int)uVar4 < (int)(uint)i[lVar16 + lVar2]) {
              if ((int)uVar4 < (int)(uint)i[lVar15 + lVar2]) {
                if ((int)uVar4 < (int)(uint)i[lVar14 + lVar2]) {
                  if ((int)uVar4 < (int)(uint)i[lVar13 + lVar2]) {
                    if ((int)uVar4 < (int)(uint)i[lVar6 + lVar2]) {
                      if ((int)uVar4 < (int)(uint)i[lVar29 + lVar2]) {
                        lVar20 = lVar12;
                        if ((int)uVar4 < (int)(uint)i[lVar30 + lVar2]) goto LAB_00351709;
                      }
                      else {
                        uVar23 = (uint)i[lVar11 + lVar2];
                        lVar20 = lVar12;
                        if ((int)(uint)i[lVar29 + lVar2] < (int)uVar22) {
                          if (uVar23 <= uVar4) {
                            if (((uVar23 < uVar22) && (i[lVar30 + lVar2] < uVar22)) &&
                               ((i[lVar31 + lVar2] < uVar22 &&
                                ((i[lVar7 + lVar2] < uVar22 && (i[lVar8 + lVar2] < uVar22)))))) {
                              bVar1 = i[lVar9 + lVar2];
                              lVar21 = lVar10;
                              goto joined_r0x003511b6;
                            }
                            goto LAB_00351daf;
                          }
                        }
                        else {
joined_r0x003509c2:
                          if (uVar23 <= uVar4) goto LAB_00351daf;
                        }
                      }
                      goto LAB_00351690;
                    }
                    if ((int)(uint)i[lVar6 + lVar2] < (int)uVar22) {
                      if (uVar4 < i[lVar12 + lVar2]) {
                        bVar1 = i[lVar10 + lVar2];
                        lVar20 = lVar11;
                        if (uVar4 < bVar1) goto LAB_00351690;
                        if ((((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar29 + lVar2] < uVar22))
                            && (i[lVar30 + lVar2] < uVar22)) &&
                           ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) {
                          bVar1 = i[lVar8 + lVar2];
                          lVar19 = lVar9;
                          goto joined_r0x00350251;
                        }
                      }
                      else if (((i[lVar29 + lVar2] < uVar22) && (i[lVar30 + lVar2] < uVar22)) &&
                              ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) {
                        bVar1 = i[lVar8 + lVar2];
                        goto joined_r0x003513fa;
                      }
                    }
                    else {
                      if (uVar4 < i[lVar10 + lVar2]) {
LAB_003509bc:
                        bVar1 = i[lVar21 + lVar2];
                        lVar20 = lVar12;
joined_r0x003509c2:
                        uVar23 = (uint)bVar1;
                        goto joined_r0x003509c2;
                      }
                      if (((((int)(uint)i[lVar10 + lVar2] < (int)uVar22) &&
                           (i[lVar29 + lVar2] < uVar22)) && (i[lVar30 + lVar2] < uVar22)) &&
                         ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) {
                        bVar1 = i[lVar8 + lVar2];
                        lVar20 = lVar9;
                        goto joined_r0x00350fe3;
                      }
                    }
                  }
                  else if ((int)(uint)i[lVar13 + lVar2] < (int)uVar22) {
                    bVar1 = i[lVar11 + lVar2];
                    if (uVar4 < bVar1) {
                      bVar1 = i[lVar9 + lVar2];
                      if (uVar4 < bVar1) {
                        if (uVar4 < i[lVar10 + lVar2]) {
                          if (i[lVar12 + lVar2] <= uVar4) {
                            bVar1 = i[lVar6 + lVar2];
                            goto joined_r0x003504d2;
                          }
                          goto LAB_00351709;
                        }
                      }
                      else if ((((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar6 + lVar2] < uVar22)
                                ) && (i[lVar29 + lVar2] < uVar22)) &&
                              ((i[lVar30 + lVar2] < uVar22 && (i[lVar31 + lVar2] < uVar22)))) {
                        bVar1 = i[lVar7 + lVar2];
                        lVar18 = lVar8;
                        goto joined_r0x00350f7d;
                      }
                    }
                    else if (uVar22 < bVar1 || uVar22 == bVar1) {
                      if ((((i[lVar6 + lVar2] < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                          (i[lVar30 + lVar2] < uVar22)) &&
                         ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22))))
                      goto LAB_00350f72;
                    }
                    else if (((i[lVar29 + lVar2] < uVar22) && (i[lVar30 + lVar2] < uVar22)) &&
                            ((i[lVar31 + lVar2] < uVar22 &&
                             ((i[lVar7 + lVar2] < uVar22 && (i[lVar8 + lVar2] < uVar22)))))) {
                      bVar1 = i[lVar9 + lVar2];
                      lVar20 = lVar10;
                      goto joined_r0x00350b28;
                    }
                  }
                  else if (uVar4 < i[lVar9 + lVar2]) {
                    if ((uVar4 < i[lVar10 + lVar2]) && (uVar4 < i[lVar11 + lVar2])) {
                      if (uVar4 < i[lVar12 + lVar2]) goto LAB_00351709;
                      bVar1 = i[lVar6 + lVar2];
joined_r0x003504d2:
                      if (((uVar4 < bVar1) && (uVar4 < i[lVar29 + lVar2])) &&
                         ((uVar4 < i[lVar30 + lVar2] && (uVar4 < i[lVar31 + lVar2])))) {
                        bVar1 = i[lVar7 + lVar2];
                        lVar20 = lVar8;
                        goto joined_r0x00350508;
                      }
                    }
                  }
                  else if ((((((int)(uint)i[lVar9 + lVar2] < (int)uVar22) &&
                             (i[lVar29 + lVar2] < uVar22)) && (i[lVar30 + lVar2] < uVar22)) &&
                           ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) &&
                          (i[lVar8 + lVar2] < uVar22)) {
                    bVar1 = i[lVar10 + lVar2];
                    lVar20 = lVar11;
joined_r0x00350b28:
                    if ((bVar1 < uVar22) && (i[lVar20 + lVar2] < uVar22)) {
                      bVar1 = i[lVar6 + lVar2];
                      lVar18 = lVar12;
                      goto joined_r0x0034f8a1;
                    }
                  }
                }
                else if ((int)(uint)i[lVar14 + lVar2] < (int)uVar22) {
                  bVar1 = i[lVar10 + lVar2];
                  if (uVar4 < bVar1) {
                    bVar1 = i[lVar8 + lVar2];
                    if (uVar4 < bVar1) {
                      if (uVar4 < i[lVar9 + lVar2]) {
                        if (uVar4 < i[lVar11 + lVar2]) goto LAB_003500a9;
                        if (uVar4 < i[lVar13 + lVar2]) goto LAB_00351242;
                      }
                    }
                    else if ((((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar13 + lVar2] < uVar22))
                             && (i[lVar6 + lVar2] < uVar22)) &&
                            ((i[lVar29 + lVar2] < uVar22 && (i[lVar30 + lVar2] < uVar22)))) {
                      bVar1 = i[lVar31 + lVar2];
                      lVar17 = lVar7;
joined_r0x00350a1f:
                      if (bVar1 < uVar22) goto LAB_00350a2a;
                    }
                  }
                  else if (uVar22 < bVar1 || uVar22 == bVar1) {
                    if ((((i[lVar13 + lVar2] < uVar22) && (i[lVar6 + lVar2] < uVar22)) &&
                        (i[lVar29 + lVar2] < uVar22)) &&
                       ((i[lVar30 + lVar2] < uVar22 && (i[lVar31 + lVar2] < uVar22)))) {
                      bVar1 = i[lVar7 + lVar2];
                      goto joined_r0x00350a1f;
                    }
                  }
                  else if (((i[lVar29 + lVar2] < uVar22) && (i[lVar30 + lVar2] < uVar22)) &&
                          ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) {
                    bVar1 = i[lVar8 + lVar2];
                    lVar20 = lVar9;
                    goto joined_r0x0035055d;
                  }
                }
                else if (uVar4 < i[lVar8 + lVar2]) {
                  if ((uVar4 < i[lVar9 + lVar2]) && (uVar4 < i[lVar10 + lVar2])) {
                    if (uVar4 < i[lVar11 + lVar2]) {
LAB_003500a9:
                      if (uVar4 < i[lVar12 + lVar2]) goto LAB_00351709;
                    }
                    else if (i[lVar13 + lVar2] <= uVar4) goto LAB_00351daf;
LAB_00351242:
                    if (((uVar4 < i[lVar6 + lVar2]) && (uVar4 < i[lVar29 + lVar2])) &&
                       (uVar4 < i[lVar30 + lVar2])) {
                      bVar1 = i[lVar31 + lVar2];
                      goto joined_r0x003509c2;
                    }
                  }
                }
                else if (((((int)(uint)i[lVar8 + lVar2] < (int)uVar22) &&
                          (i[lVar29 + lVar2] < uVar22)) && (i[lVar30 + lVar2] < uVar22)) &&
                        ((i[lVar31 + lVar2] < uVar22 && (i[lVar7 + lVar2] < uVar22)))) {
                  bVar1 = i[lVar9 + lVar2];
                  lVar20 = lVar10;
joined_r0x0035055d:
                  if ((bVar1 < uVar22) && (i[lVar20 + lVar2] < uVar22)) {
                    if (uVar22 <= i[lVar6 + lVar2]) goto LAB_003516ec;
                    bVar1 = i[lVar13 + lVar2];
                    lVar18 = lVar11;
                    goto joined_r0x0034fbac;
                  }
                }
              }
              else {
                uVar23 = (uint)i[lVar7 + lVar2];
                lVar20 = lVar10;
                if ((int)(uint)i[lVar15 + lVar2] < (int)uVar22) {
                  if (uVar4 < uVar23) {
                    if ((uVar4 < i[lVar8 + lVar2]) && (uVar4 < i[lVar9 + lVar2])) {
                      if (i[lVar10 + lVar2] <= uVar4) {
                        bVar1 = i[lVar14 + lVar2];
                        goto joined_r0x00350d3d;
                      }
LAB_0034fd72:
                      if (i[lVar11 + lVar2] <= uVar4) goto LAB_00350d43;
                      if (uVar4 < i[lVar12 + lVar2]) goto LAB_00351709;
LAB_00350d54:
                      if (((uVar4 < i[lVar6 + lVar2]) && (uVar4 < i[lVar29 + lVar2])) &&
                         (uVar4 < i[lVar30 + lVar2])) {
                        uVar22 = (uint)i[lVar31 + lVar2];
                        goto LAB_00351694;
                      }
                    }
                  }
                  else if (((uVar23 < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                          ((i[lVar30 + lVar2] < uVar22 &&
                           ((i[lVar31 + lVar2] < uVar22 && (i[lVar8 + lVar2] < uVar22)))))) {
                    if (i[lVar6 + lVar2] < uVar22) {
                      if (uVar22 <= i[lVar13 + lVar2]) goto LAB_00351400;
                      if (uVar22 <= i[lVar14 + lVar2]) goto LAB_00350f88;
                      goto LAB_00351709;
                    }
                    bVar1 = i[lVar9 + lVar2];
joined_r0x00350fe3:
                    if (bVar1 < uVar22) goto LAB_003516db;
                  }
                }
                else if (uVar4 < uVar23) {
                  if ((uVar4 < i[lVar8 + lVar2]) && (uVar4 < i[lVar9 + lVar2])) {
                    if (uVar4 < i[lVar10 + lVar2]) goto LAB_0034fd72;
                    bVar1 = i[lVar14 + lVar2];
joined_r0x00350d3d:
                    if (uVar4 < bVar1) {
LAB_00350d43:
                      if (uVar4 < i[lVar13 + lVar2]) goto LAB_00350d54;
                    }
                  }
                }
                else if (((((int)uVar23 < (int)uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                         (i[lVar30 + lVar2] < uVar22)) &&
                        (((i[lVar31 + lVar2] < uVar22 && (i[lVar8 + lVar2] < uVar22)) &&
                         (i[lVar9 + lVar2] < uVar22)))) {
                  if (i[lVar6 + lVar2] < uVar22) {
                    if (uVar22 <= i[lVar13 + lVar2]) goto LAB_00351416;
                    bVar1 = i[lVar14 + lVar2];
                    lVar18 = lVar10;
joined_r0x0034fbac:
                    if (uVar22 <= bVar1) goto LAB_003516fd;
                    goto LAB_00351709;
                  }
LAB_003516db:
                  bVar1 = i[lVar20 + lVar2];
joined_r0x003511b6:
                  if (bVar1 < uVar22) {
LAB_003516ec:
                    bVar1 = i[lVar21 + lVar2];
                    lVar18 = lVar12;
                    goto joined_r0x00350390;
                  }
                }
              }
            }
            else {
              uVar23 = (uint)i[lVar31 + lVar2];
              if ((int)(uint)i[lVar16 + lVar2] < (int)uVar22) {
                if (uVar4 < uVar23) {
                  if ((uVar4 < i[lVar7 + lVar2]) && (uVar4 < i[lVar8 + lVar2])) {
                    if (uVar4 < i[lVar9 + lVar2]) {
                      if (i[lVar10 + lVar2] <= uVar4) {
LAB_00350739:
                        bVar1 = i[lVar14 + lVar2];
                        goto joined_r0x00350860;
                      }
LAB_0034fa71:
                      if (i[lVar11 + lVar2] <= uVar4) goto LAB_00350c69;
                      if (uVar4 < i[lVar12 + lVar2]) goto LAB_00351709;
LAB_00350c7a:
                      if ((uVar4 < i[lVar6 + lVar2]) && (uVar4 < i[lVar29 + lVar2])) {
                        uVar22 = (uint)i[lVar30 + lVar2];
                        goto LAB_00351694;
                      }
                    }
                    else if (uVar4 < i[lVar15 + lVar2]) goto LAB_00350739;
                  }
                }
                else if ((((uVar23 < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                         (i[lVar30 + lVar2] < uVar22)) && (i[lVar7 + lVar2] < uVar22)) {
                  if (i[lVar6 + lVar2] < uVar22) {
                    if (i[lVar13 + lVar2] < uVar22) {
                      if (i[lVar14 + lVar2] < uVar22) {
                        if (i[lVar15 + lVar2] < uVar22) goto LAB_00351709;
LAB_00350a2a:
                        bVar1 = i[lVar17 + lVar2];
                        goto joined_r0x00350390;
                      }
LAB_00350f72:
                      bVar1 = i[lVar8 + lVar2];
joined_r0x00350f7d:
                      if (bVar1 < uVar22) goto LAB_00350f88;
                    }
                    else {
                      bVar1 = i[lVar8 + lVar2];
joined_r0x003513fa:
                      if (bVar1 < uVar22) goto LAB_00351400;
                    }
                  }
                  else if (i[lVar8 + lVar2] < uVar22) goto LAB_0035119a;
                }
              }
              else if (uVar4 < uVar23) {
                if ((uVar4 < i[lVar7 + lVar2]) && (uVar4 < i[lVar8 + lVar2])) {
                  if (uVar4 < i[lVar9 + lVar2]) {
                    if (uVar4 < i[lVar10 + lVar2]) goto LAB_0034fa71;
                    bVar1 = i[lVar14 + lVar2];
                  }
                  else {
                    if (i[lVar15 + lVar2] <= uVar4) goto LAB_00351daf;
                    bVar1 = i[lVar14 + lVar2];
                  }
joined_r0x00350860:
                  if (uVar4 < bVar1) {
LAB_00350c69:
                    if (uVar4 < i[lVar13 + lVar2]) goto LAB_00350c7a;
                  }
                }
              }
              else if (((((int)uVar23 < (int)uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                       (i[lVar30 + lVar2] < uVar22)) &&
                      ((i[lVar7 + lVar2] < uVar22 && (i[lVar8 + lVar2] < uVar22)))) {
                if (i[lVar6 + lVar2] < uVar22) {
                  if (i[lVar13 + lVar2] < uVar22) {
                    if (i[lVar14 + lVar2] < uVar22) {
                      bVar1 = i[lVar15 + lVar2];
                      goto joined_r0x0034f8a1;
                    }
LAB_00350f88:
                    bVar1 = i[lVar18 + lVar2];
                    lVar18 = lVar10;
                    goto joined_r0x00350390;
                  }
LAB_00351400:
                  bVar1 = i[lVar9 + lVar2];
joined_r0x00350251:
                  if (bVar1 < uVar22) {
LAB_00351416:
                    bVar1 = i[lVar19 + lVar2];
                    lVar18 = lVar11;
                    goto joined_r0x00350390;
                  }
                }
                else {
LAB_0035119a:
                  if (i[lVar9 + lVar2] < uVar22) {
                    bVar1 = i[lVar10 + lVar2];
                    goto joined_r0x003511b6;
                  }
                }
              }
            }
          }
          else {
            uVar23 = (uint)i[lVar30 + lVar2];
            if ((int)(uint)i[lVar33 + lVar2] < (int)uVar22) {
              if (uVar4 < uVar23) {
                if ((uVar4 < i[lVar31 + lVar2]) && (uVar4 < i[lVar7 + lVar2])) {
                  if (uVar4 < i[lVar8 + lVar2]) {
                    if (i[lVar9 + lVar2] <= uVar4) {
LAB_003502bb:
                      bVar1 = i[lVar15 + lVar2];
                      goto joined_r0x00350336;
                    }
LAB_0034f7eb:
                    if (i[lVar10 + lVar2] <= uVar4) goto LAB_00350760;
                    if (i[lVar11 + lVar2] <= uVar4) goto LAB_00350771;
                    if (uVar4 < i[lVar12 + lVar2]) goto LAB_00351709;
LAB_00350782:
                    if (uVar4 < i[lVar6 + lVar2]) {
                      uVar22 = (uint)i[lVar29 + lVar2];
                      goto LAB_00351694;
                    }
                  }
                  else if (uVar4 < i[lVar16 + lVar2]) goto LAB_003502bb;
                }
              }
              else if (((uVar23 < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                      (i[lVar31 + lVar2] < uVar22)) {
                if (i[lVar6 + lVar2] < uVar22) {
                  if (i[lVar13 + lVar2] < uVar22) {
                    if (i[lVar14 + lVar2] < uVar22) {
                      if (i[lVar15 + lVar2] < uVar22) {
                        if (i[lVar16 + lVar2] < uVar22) goto LAB_00351709;
LAB_0034fa0e:
                        bVar1 = i[lVar7 + lVar2];
                        lVar18 = lVar8;
                        goto joined_r0x00350390;
                      }
                      if (i[lVar7 + lVar2] < uVar22) goto LAB_003513a8;
                    }
                    else if (i[lVar7 + lVar2] < uVar22) goto LAB_003510e8;
                  }
                  else if (i[lVar7 + lVar2] < uVar22) {
                    bVar1 = i[lVar8 + lVar2];
                    goto joined_r0x0035115c;
                  }
                }
                else if ((i[lVar7 + lVar2] < uVar22) && (i[lVar8 + lVar2] < uVar22)) {
                  bVar1 = i[lVar9 + lVar2];
joined_r0x00350d05:
                  if ((bVar1 < uVar22) && (i[lVar10 + lVar2] < uVar22)) goto LAB_00350d1c;
                }
              }
            }
            else if (uVar4 < uVar23) {
              if ((uVar4 < i[lVar31 + lVar2]) && (uVar4 < i[lVar7 + lVar2])) {
                if (uVar4 < i[lVar8 + lVar2]) {
                  if (uVar4 < i[lVar9 + lVar2]) goto LAB_0034f7eb;
                  bVar1 = i[lVar15 + lVar2];
                }
                else {
                  if (i[lVar16 + lVar2] <= uVar4) goto LAB_00351daf;
                  bVar1 = i[lVar15 + lVar2];
                }
joined_r0x00350336:
                if (uVar4 < bVar1) {
LAB_00350760:
                  if (uVar4 < i[lVar14 + lVar2]) {
LAB_00350771:
                    if (uVar4 < i[lVar13 + lVar2]) goto LAB_00350782;
                  }
                }
              }
            }
            else if (((((int)uVar23 < (int)uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                     (i[lVar31 + lVar2] < uVar22)) && (i[lVar7 + lVar2] < uVar22)) {
              if (i[lVar6 + lVar2] < uVar22) {
                if (i[lVar13 + lVar2] < uVar22) {
                  if (i[lVar14 + lVar2] < uVar22) {
                    if (i[lVar15 + lVar2] < uVar22) {
                      bVar1 = i[lVar16 + lVar2];
                      lVar18 = lVar8;
                      goto joined_r0x0034fbac;
                    }
LAB_003513a8:
                    bVar1 = i[lVar8 + lVar2];
                    goto joined_r0x00350390;
                  }
LAB_003510e8:
                  if (i[lVar8 + lVar2] < uVar22) {
                    bVar1 = i[lVar9 + lVar2];
                    lVar18 = lVar10;
                    goto joined_r0x00350390;
                  }
                }
                else {
                  bVar1 = i[lVar8 + lVar2];
joined_r0x0035115c:
                  if ((bVar1 < uVar22) && (i[lVar9 + lVar2] < uVar22)) {
                    bVar1 = i[lVar10 + lVar2];
                    lVar18 = lVar11;
                    goto joined_r0x00350390;
                  }
                }
              }
              else if (i[lVar8 + lVar2] < uVar22) {
                bVar1 = i[lVar9 + lVar2];
                goto joined_r0x00350d05;
              }
            }
          }
          goto LAB_00351daf;
        }
        lVar18 = lVar7;
        if ((int)(uint)i[pixel[0] + lVar2] < (int)uVar22) {
          bVar1 = i[lVar33 + lVar2];
          lVar20 = lVar10;
          lVar17 = lVar9;
          lVar19 = lVar8;
          if (uVar4 < bVar1) {
            bVar1 = i[lVar30 + lVar2];
            if (uVar4 < bVar1) {
              if ((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar31 + lVar2])) {
                if (uVar4 < i[lVar6 + lVar2]) {
                  if (uVar4 < i[lVar13 + lVar2]) {
                    if (uVar4 < i[lVar14 + lVar2]) {
                      if (uVar4 < i[lVar15 + lVar2]) {
                        if (i[lVar16 + lVar2] <= uVar4) {
                          bVar1 = i[lVar7 + lVar2];
                          lVar20 = lVar8;
                          goto joined_r0x0035030f;
                        }
                        goto LAB_00351709;
                      }
LAB_003515d8:
                      bVar1 = i[lVar7 + lVar2];
joined_r0x003512da:
                      if (uVar4 < bVar1) {
LAB_003515ee:
                        bVar1 = i[lVar19 + lVar2];
                        lVar20 = lVar9;
joined_r0x00350508:
                        uVar23 = (uint)bVar1;
                        goto joined_r0x003509c2;
                      }
                    }
                    else {
                      bVar1 = i[lVar7 + lVar2];
joined_r0x00351ae4:
                      if (uVar4 < bVar1) {
LAB_00350b5e:
                        bVar1 = i[lVar8 + lVar2];
joined_r0x00351822:
                        if (uVar4 < bVar1) {
LAB_00350b74:
                          bVar1 = i[lVar17 + lVar2];
                          lVar20 = lVar10;
                          goto joined_r0x003509c2;
                        }
                      }
                    }
                  }
                  else if (uVar4 < i[lVar7 + lVar2]) {
LAB_003506b8:
                    bVar1 = i[lVar8 + lVar2];
joined_r0x00351bfc:
                    if (uVar4 < bVar1) {
LAB_003506c9:
                      bVar1 = i[lVar9 + lVar2];
joined_r0x00351581:
                      if (uVar4 < bVar1) {
LAB_003506df:
                        uVar23 = (uint)i[lVar20 + lVar2];
                        lVar20 = lVar11;
                        goto joined_r0x003509c2;
                      }
                    }
                  }
                }
                else if (uVar4 < i[lVar7 + lVar2]) {
                  bVar1 = i[lVar8 + lVar2];
joined_r0x003510a5:
                  if (uVar4 < bVar1) {
                    bVar1 = i[lVar9 + lVar2];
joined_r0x0035192d:
                    if (uVar4 < bVar1) {
                      bVar1 = i[lVar20 + lVar2];
joined_r0x00351a93:
                      if (uVar4 < bVar1) goto LAB_003509bc;
                    }
                  }
                }
              }
            }
            else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar31 + lVar2] < uVar22)) &&
                    (i[lVar7 + lVar2] < uVar22)) {
              if (i[lVar8 + lVar2] < uVar22) {
                if (i[lVar9 + lVar2] < uVar22) {
                  if (uVar22 <= i[lVar10 + lVar2]) goto LAB_00350bf5;
                  if (uVar22 <= i[lVar11 + lVar2]) goto LAB_00350c06;
                  if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
LAB_00350c17:
                  bVar1 = i[lVar6 + lVar2];
joined_r0x003511ff:
                  if (bVar1 < uVar22) goto LAB_00350c28;
                }
                else {
                  if (uVar22 <= i[lVar15 + lVar2]) goto LAB_00351daf;
LAB_00350bf5:
                  if (i[lVar14 + lVar2] < uVar22) {
LAB_00350c06:
                    if (i[lVar13 + lVar2] < uVar22) goto LAB_00350c17;
                  }
                }
              }
              else if ((i[lVar16 + lVar2] < uVar22) && (i[lVar15 + lVar2] < uVar22))
              goto LAB_00350bf5;
            }
          }
          else if (uVar22 < bVar1 || uVar22 == bVar1) {
            bVar1 = i[lVar30 + lVar2];
            if (uVar4 < bVar1) {
              if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar31 + lVar2])) &&
                 (uVar4 < i[lVar7 + lVar2])) {
                if (uVar4 < i[lVar6 + lVar2]) {
                  if (uVar4 < i[lVar13 + lVar2]) {
                    if (uVar4 < i[lVar14 + lVar2]) {
                      if (uVar4 < i[lVar15 + lVar2]) {
                        bVar1 = i[lVar16 + lVar2];
                        lVar20 = lVar8;
                        goto joined_r0x00351917;
                      }
                      bVar1 = i[lVar8 + lVar2];
                      lVar20 = lVar9;
                    }
                    else {
                      if (i[lVar8 + lVar2] <= uVar4) goto LAB_00351daf;
                      bVar1 = i[lVar9 + lVar2];
                      lVar20 = lVar10;
                    }
                  }
                  else {
                    if ((i[lVar8 + lVar2] <= uVar4) || (i[lVar9 + lVar2] <= uVar4))
                    goto LAB_00351daf;
                    bVar1 = i[lVar10 + lVar2];
                    lVar20 = lVar11;
                  }
                }
                else {
                  if (((i[lVar8 + lVar2] <= uVar4) || (i[lVar9 + lVar2] <= uVar4)) ||
                     (i[lVar10 + lVar2] <= uVar4)) goto LAB_00351daf;
                  bVar1 = i[lVar11 + lVar2];
                  lVar20 = lVar12;
                }
                goto joined_r0x0035030f;
              }
            }
            else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar31 + lVar2] < uVar22)) &&
                    (i[lVar7 + lVar2] < uVar22)) {
              if (uVar22 <= i[lVar8 + lVar2]) {
                if (((uVar22 <= i[lVar16 + lVar2]) || (uVar22 <= i[lVar15 + lVar2])) ||
                   ((uVar22 <= i[lVar14 + lVar2] || (uVar22 <= i[lVar13 + lVar2]))))
                goto LAB_00351daf;
                bVar1 = i[lVar6 + lVar2];
                goto joined_r0x003511ff;
              }
              if (uVar22 <= i[lVar9 + lVar2]) {
                if (((i[lVar15 + lVar2] < uVar22) && (i[lVar14 + lVar2] < uVar22)) &&
                   (i[lVar13 + lVar2] < uVar22)) {
                  bVar1 = i[lVar6 + lVar2];
                  goto joined_r0x003511ff;
                }
                goto LAB_00351daf;
              }
              if (uVar22 <= i[lVar10 + lVar2]) {
                if ((i[lVar14 + lVar2] < uVar22) && (i[lVar13 + lVar2] < uVar22)) {
                  bVar1 = i[lVar6 + lVar2];
                  goto joined_r0x003511ff;
                }
                goto LAB_00351daf;
              }
              if (i[lVar11 + lVar2] < uVar22) {
                if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                bVar1 = i[lVar6 + lVar2];
              }
              else {
                if (uVar22 <= i[lVar13 + lVar2]) goto LAB_00351daf;
                bVar1 = i[lVar6 + lVar2];
              }
              if (uVar22 <= bVar1) goto LAB_00351daf;
LAB_00350c28:
              uVar4 = (uint)i[lVar29 + lVar2];
              goto LAB_00351701;
            }
          }
          else {
            bVar1 = i[lVar16 + lVar2];
            if (uVar4 < bVar1) {
              bVar1 = i[lVar31 + lVar2];
              if (uVar4 < bVar1) {
                if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                   (uVar4 < i[lVar7 + lVar2])) {
                  if (i[lVar6 + lVar2] <= uVar4) {
                    bVar1 = i[lVar8 + lVar2];
                    goto joined_r0x003510a5;
                  }
                  if (i[lVar13 + lVar2] <= uVar4) goto LAB_003506b8;
                  if (i[lVar14 + lVar2] <= uVar4) goto LAB_00350b5e;
                  if (i[lVar15 + lVar2] <= uVar4) goto LAB_003515ee;
                  goto LAB_00351709;
                }
              }
              else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar7 + lVar2] < uVar22)) &&
                      (i[lVar8 + lVar2] < uVar22)) {
                if (i[lVar9 + lVar2] < uVar22) {
                  if (i[lVar10 + lVar2] < uVar22) {
                    if (uVar22 <= i[lVar11 + lVar2]) goto LAB_00351475;
                    if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                  }
                  else {
                    if (uVar22 <= i[lVar14 + lVar2]) goto LAB_00351daf;
LAB_00351475:
                    if (uVar22 <= i[lVar13 + lVar2]) goto LAB_00351daf;
                  }
                  if (i[lVar6 + lVar2] < uVar22) {
                    bVar1 = i[lVar29 + lVar2];
joined_r0x00351987:
                    if (bVar1 < uVar22) goto LAB_003514a3;
                  }
                }
                else if ((i[lVar15 + lVar2] < uVar22) && (i[lVar14 + lVar2] < uVar22))
                goto LAB_00351475;
              }
            }
            else if (uVar22 < bVar1 || uVar22 == bVar1) {
              bVar1 = i[lVar31 + lVar2];
              if (uVar4 < bVar1) {
                if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                   ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar8 + lVar2])))) {
                  if (uVar4 < i[lVar6 + lVar2]) {
                    if (uVar4 < i[lVar13 + lVar2]) {
                      if (uVar4 < i[lVar14 + lVar2]) {
                        bVar1 = i[lVar15 + lVar2];
                        lVar20 = lVar9;
joined_r0x00351917:
                        if (bVar1 <= uVar4) goto LAB_00351690;
                        goto LAB_00351709;
                      }
                      bVar1 = i[lVar9 + lVar2];
                      lVar20 = lVar10;
                    }
                    else {
                      if (i[lVar9 + lVar2] <= uVar4) goto LAB_00351daf;
                      bVar1 = i[lVar10 + lVar2];
                      lVar20 = lVar11;
                    }
                  }
                  else {
                    if ((i[lVar9 + lVar2] <= uVar4) || (i[lVar10 + lVar2] <= uVar4))
                    goto LAB_00351daf;
                    bVar1 = i[lVar11 + lVar2];
                    lVar20 = lVar12;
                  }
                  goto joined_r0x0035030f;
                }
              }
              else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar7 + lVar2] < uVar22)) &&
                      (i[lVar8 + lVar2] < uVar22)) {
                if (i[lVar9 + lVar2] < uVar22) {
                  if (uVar22 <= i[lVar10 + lVar2]) {
                    if (((i[lVar14 + lVar2] < uVar22) && (i[lVar13 + lVar2] < uVar22)) &&
                       (i[lVar6 + lVar2] < uVar22)) {
                      bVar1 = i[lVar29 + lVar2];
                      goto joined_r0x003514f6;
                    }
                    goto LAB_00351daf;
                  }
                  if (i[lVar11 + lVar2] < uVar22) {
                    if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                    if (i[lVar6 + lVar2] < uVar22) {
                      bVar1 = i[lVar29 + lVar2];
                      goto joined_r0x00351987;
                    }
                    goto LAB_00351daf;
                  }
                  if ((uVar22 <= i[lVar13 + lVar2]) || (uVar22 <= i[lVar6 + lVar2]))
                  goto LAB_00351daf;
                  bVar1 = i[lVar29 + lVar2];
                  goto joined_r0x00351987;
                }
                if ((((uVar22 <= i[lVar15 + lVar2]) || (uVar22 <= i[lVar14 + lVar2])) ||
                    (uVar22 <= i[lVar13 + lVar2])) || (uVar22 <= i[lVar6 + lVar2]))
                goto LAB_00351daf;
                bVar1 = i[lVar29 + lVar2];
joined_r0x003514f6:
                if (uVar22 <= bVar1) goto LAB_00351daf;
LAB_003514a3:
                uVar4 = (uint)i[lVar30 + lVar2];
                goto LAB_00351701;
              }
            }
            else {
              bVar1 = i[lVar15 + lVar2];
              if (uVar4 < bVar1) {
                bVar1 = i[lVar7 + lVar2];
                if (uVar4 < bVar1) {
                  if ((((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                      (uVar4 < i[lVar31 + lVar2])) && (uVar4 < i[lVar8 + lVar2])) {
                    if (i[lVar6 + lVar2] <= uVar4) {
                      bVar1 = i[lVar9 + lVar2];
                      goto joined_r0x0035192d;
                    }
                    if (i[lVar13 + lVar2] <= uVar4) goto LAB_003506c9;
                    if (i[lVar14 + lVar2] <= uVar4) goto LAB_00350b74;
                    goto LAB_00351709;
                  }
                }
                else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar8 + lVar2] < uVar22)) &&
                        (i[lVar9 + lVar2] < uVar22)) {
                  if (i[lVar10 + lVar2] < uVar22) {
                    if (uVar22 <= i[lVar11 + lVar2]) {
                      if (i[lVar13 + lVar2] < uVar22) {
                        bVar1 = i[lVar6 + lVar2];
                        goto joined_r0x003517ba;
                      }
                      goto LAB_00351daf;
                    }
                    if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                    if (uVar22 <= i[lVar6 + lVar2]) goto LAB_00351daf;
LAB_003519b4:
                    if (uVar22 <= i[lVar29 + lVar2]) goto LAB_00351daf;
                    bVar1 = i[lVar30 + lVar2];
joined_r0x00351bb0:
                    if (uVar22 <= bVar1) goto LAB_00351daf;
                    uVar4 = (uint)i[lVar31 + lVar2];
                    goto LAB_00351701;
                  }
                  if ((i[lVar14 + lVar2] < uVar22) && (i[lVar13 + lVar2] < uVar22)) {
                    bVar1 = i[lVar6 + lVar2];
joined_r0x003517ba:
                    if (bVar1 < uVar22) goto LAB_003519b4;
                  }
                }
              }
              else if (uVar22 < bVar1 || uVar22 == bVar1) {
                bVar1 = i[lVar7 + lVar2];
                if (uVar4 < bVar1) {
                  if ((((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                      (uVar4 < i[lVar31 + lVar2])) &&
                     ((uVar4 < i[lVar8 + lVar2] && (uVar4 < i[lVar9 + lVar2])))) {
                    if (uVar4 < i[lVar6 + lVar2]) {
                      if (uVar4 < i[lVar13 + lVar2]) {
                        bVar1 = i[lVar14 + lVar2];
                        lVar20 = lVar10;
                        goto joined_r0x00351917;
                      }
                      goto LAB_003506df;
                    }
                    if (uVar4 < i[lVar10 + lVar2]) {
                      bVar1 = i[lVar11 + lVar2];
                      lVar20 = lVar12;
                      goto joined_r0x0035030f;
                    }
                  }
                }
                else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar8 + lVar2] < uVar22)) &&
                        (i[lVar9 + lVar2] < uVar22)) {
                  if (i[lVar10 + lVar2] < uVar22) {
                    if (i[lVar11 + lVar2] < uVar22) {
                      if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                      if ((i[lVar6 + lVar2] < uVar22) && (i[lVar29 + lVar2] < uVar22)) {
                        bVar1 = i[lVar30 + lVar2];
                        goto joined_r0x00351bb0;
                      }
                    }
                    else if (((i[lVar13 + lVar2] < uVar22) && (i[lVar6 + lVar2] < uVar22)) &&
                            (i[lVar29 + lVar2] < uVar22)) {
                      bVar1 = i[lVar30 + lVar2];
                      goto joined_r0x00351bb0;
                    }
                  }
                  else if (((i[lVar14 + lVar2] < uVar22) && (i[lVar13 + lVar2] < uVar22)) &&
                          ((i[lVar6 + lVar2] < uVar22 && (i[lVar29 + lVar2] < uVar22)))) {
                    bVar1 = i[lVar30 + lVar2];
                    goto joined_r0x00351bb0;
                  }
                }
              }
              else {
                bVar1 = i[lVar14 + lVar2];
                if (uVar4 < bVar1) {
                  bVar1 = i[lVar10 + lVar2];
                  if (uVar4 < bVar1) {
                    if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                       ((uVar4 < i[lVar31 + lVar2] &&
                        ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar8 + lVar2])))))) {
                      bVar1 = i[lVar9 + lVar2];
joined_r0x0035134f:
                      if (uVar4 < bVar1) {
                        if (i[lVar6 + lVar2] <= uVar4) goto LAB_003509bc;
                        bVar1 = i[lVar13 + lVar2];
                        lVar20 = lVar11;
                        goto joined_r0x00351917;
                      }
                    }
                  }
                  else if (uVar22 < bVar1 || uVar22 == bVar1) {
                    if ((((uVar4 < i[lVar13 + lVar2]) && (uVar4 < i[lVar6 + lVar2])) &&
                        (uVar4 < i[lVar29 + lVar2])) &&
                       ((uVar4 < i[lVar30 + lVar2] && (uVar4 < i[lVar31 + lVar2]))))
                    goto LAB_003515d8;
                  }
                  else {
                    bVar1 = i[lVar8 + lVar2];
                    if (uVar4 < bVar1) {
                      if ((((uVar4 < i[lVar13 + lVar2]) && (uVar4 < i[lVar6 + lVar2])) &&
                          (uVar4 < i[lVar29 + lVar2])) && (uVar4 < i[lVar30 + lVar2])) {
                        bVar1 = i[lVar31 + lVar2];
                        lVar19 = lVar7;
                        goto joined_r0x003512da;
                      }
                    }
                    else if ((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar9 + lVar2] < uVar22)) {
                      if (i[lVar11 + lVar2] < uVar22) {
                        if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                        if (i[lVar6 + lVar2] < uVar22) {
                          bVar1 = i[lVar29 + lVar2];
                          goto joined_r0x00351d67;
                        }
                      }
                      else if ((i[lVar13 + lVar2] < uVar22) && (i[lVar6 + lVar2] < uVar22)) {
                        bVar1 = i[lVar29 + lVar2];
joined_r0x00351d67:
                        if ((bVar1 < uVar22) && (i[lVar30 + lVar2] < uVar22)) {
                          bVar1 = i[lVar31 + lVar2];
                          goto joined_r0x00350390;
                        }
                      }
                    }
                  }
                }
                else if (uVar22 < bVar1 || uVar22 == bVar1) {
                  bVar1 = i[lVar8 + lVar2];
                  if (uVar4 < bVar1) {
                    if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                       ((uVar4 < i[lVar31 + lVar2] &&
                        ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar9 + lVar2])))))) {
                      bVar1 = i[lVar10 + lVar2];
                      goto joined_r0x0035134f;
                    }
                  }
                  else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar9 + lVar2] < uVar22)) &&
                          (i[lVar10 + lVar2] < uVar22)) {
                    if (i[lVar11 + lVar2] < uVar22) {
                      if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                      if ((i[lVar6 + lVar2] < uVar22) && (i[lVar29 + lVar2] < uVar22)) {
                        bVar1 = i[lVar30 + lVar2];
                        goto joined_r0x00351d36;
                      }
                    }
                    else if (((i[lVar13 + lVar2] < uVar22) && (i[lVar6 + lVar2] < uVar22)) &&
                            (i[lVar29 + lVar2] < uVar22)) {
                      bVar1 = i[lVar30 + lVar2];
joined_r0x00351d36:
                      if (bVar1 < uVar22) {
                        bVar1 = i[lVar31 + lVar2];
                        goto joined_r0x00350390;
                      }
                    }
                  }
                }
                else {
                  bVar1 = i[lVar13 + lVar2];
                  if (uVar4 < bVar1) {
                    bVar1 = i[lVar11 + lVar2];
                    if (uVar4 < bVar1) {
                      if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                         ((uVar4 < i[lVar31 + lVar2] &&
                          ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar8 + lVar2])))))) {
                        bVar1 = i[lVar9 + lVar2];
                        lVar20 = lVar10;
joined_r0x003518f5:
                        if ((uVar4 < bVar1) && (uVar4 < i[lVar20 + lVar2])) {
                          bVar1 = i[lVar6 + lVar2];
                          lVar20 = lVar12;
                          goto joined_r0x00351917;
                        }
                      }
                    }
                    else if (uVar22 < bVar1 || uVar22 == bVar1) {
                      if (((uVar4 < i[lVar6 + lVar2]) && (uVar4 < i[lVar29 + lVar2])) &&
                         ((uVar4 < i[lVar30 + lVar2] && (uVar4 < i[lVar31 + lVar2])))) {
                        bVar1 = i[lVar7 + lVar2];
                        goto joined_r0x00351ae4;
                      }
                    }
                    else {
                      bVar1 = i[lVar9 + lVar2];
                      if (uVar4 < bVar1) {
                        if (((uVar4 < i[lVar6 + lVar2]) && (uVar4 < i[lVar29 + lVar2])) &&
                           ((uVar4 < i[lVar30 + lVar2] && (uVar4 < i[lVar31 + lVar2])))) {
                          bVar1 = i[lVar7 + lVar2];
                          lVar17 = lVar8;
                          goto joined_r0x00351822;
                        }
                      }
                      else if ((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar10 + lVar2] < uVar22))
                      {
                        if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                        if (((i[lVar6 + lVar2] < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                           (i[lVar30 + lVar2] < uVar22)) {
                          bVar1 = i[lVar31 + lVar2];
                          goto joined_r0x00351b5b;
                        }
                      }
                    }
                  }
                  else if (uVar22 < bVar1 || uVar22 == bVar1) {
                    bVar1 = i[lVar9 + lVar2];
                    if (uVar4 < bVar1) {
                      if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                         ((uVar4 < i[lVar31 + lVar2] &&
                          ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar8 + lVar2])))))) {
                        bVar1 = i[lVar10 + lVar2];
                        lVar20 = lVar11;
                        goto joined_r0x003518f5;
                      }
                    }
                    else if (((bVar1 <= uVar22 && uVar22 != bVar1) && (i[lVar10 + lVar2] < uVar22))
                            && (i[lVar11 + lVar2] < uVar22)) {
                      if (i[lVar12 + lVar2] < uVar22) goto LAB_00351709;
                      if (((i[lVar6 + lVar2] < uVar22) && (i[lVar29 + lVar2] < uVar22)) &&
                         (i[lVar30 + lVar2] < uVar22)) {
                        bVar1 = i[lVar31 + lVar2];
joined_r0x00351b5b:
                        if (bVar1 < uVar22) goto LAB_0034fa0e;
                      }
                    }
                  }
                  else {
                    bVar1 = i[lVar6 + lVar2];
                    if (uVar4 < bVar1) {
                      if (i[lVar12 + lVar2] < uVar22) {
                        bVar1 = i[lVar10 + lVar2];
                        if (uVar4 < bVar1) {
                          if ((((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                              (uVar4 < i[lVar31 + lVar2])) && (uVar4 < i[lVar7 + lVar2])) {
                            bVar1 = i[lVar8 + lVar2];
                            lVar20 = lVar9;
                            goto joined_r0x00351581;
                          }
                        }
                        else {
                          lVar18 = lVar11;
                          if (bVar1 <= uVar22 && uVar22 != bVar1) goto LAB_003516fd;
                        }
                      }
                      else if (((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                              ((uVar4 < i[lVar31 + lVar2] && (uVar4 < i[lVar7 + lVar2])))) {
                        bVar1 = i[lVar8 + lVar2];
                        goto joined_r0x00351bfc;
                      }
                    }
                    else if (uVar22 < bVar1 || uVar22 == bVar1) {
                      bVar1 = i[lVar10 + lVar2];
                      if (uVar4 < bVar1) {
                        if ((((uVar4 < i[lVar29 + lVar2]) && (uVar4 < i[lVar30 + lVar2])) &&
                            (uVar4 < i[lVar31 + lVar2])) && (uVar4 < i[lVar7 + lVar2])) {
                          bVar1 = i[lVar8 + lVar2];
                          lVar20 = lVar9;
                          goto joined_r0x0035192d;
                        }
                      }
                      else if (bVar1 <= uVar22 && uVar22 != bVar1) goto LAB_00350d1c;
                    }
                    else {
                      bVar1 = i[lVar29 + lVar2];
                      if (bVar1 <= uVar4) {
                        if (bVar1 <= uVar22 && uVar22 != bVar1) {
                          bVar1 = i[lVar30 + lVar2];
                          lVar18 = lVar12;
                          goto joined_r0x0034f8a1;
                        }
LAB_00350d1c:
                        bVar1 = i[lVar11 + lVar2];
                        lVar18 = lVar12;
                        goto joined_r0x00350390;
                      }
                      bVar1 = i[lVar11 + lVar2];
                      if (uVar4 < bVar1) {
                        if (((uVar4 < i[lVar30 + lVar2]) && (uVar4 < i[lVar31 + lVar2])) &&
                           ((uVar4 < i[lVar7 + lVar2] && (uVar4 < i[lVar8 + lVar2])))) {
                          bVar1 = i[lVar9 + lVar2];
                          lVar21 = lVar10;
                          goto joined_r0x00351a93;
                        }
                      }
                      else {
                        lVar18 = lVar12;
                        if (bVar1 <= uVar22 && uVar22 != bVar1) goto LAB_003516fd;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else if (uVar4 < i[lVar29 + lVar2]) {
          if ((uVar4 < i[lVar30 + lVar2]) && (uVar4 < i[lVar31 + lVar2])) {
            if (uVar4 < i[lVar6 + lVar2]) {
              if (uVar4 < i[lVar13 + lVar2]) {
                if (uVar4 < i[lVar14 + lVar2]) {
                  if (uVar4 < i[lVar15 + lVar2]) {
                    if (uVar4 < i[lVar16 + lVar2]) {
                      bVar1 = i[lVar33 + lVar2];
                      goto joined_r0x00351917;
                    }
                    bVar1 = i[lVar7 + lVar2];
                    lVar20 = lVar8;
                  }
                  else {
                    if (i[lVar7 + lVar2] <= uVar4) goto LAB_00351daf;
                    bVar1 = i[lVar8 + lVar2];
                    lVar20 = lVar9;
                  }
                }
                else {
                  if ((i[lVar7 + lVar2] <= uVar4) || (i[lVar8 + lVar2] <= uVar4)) goto LAB_00351daf;
                  bVar1 = i[lVar9 + lVar2];
                  lVar20 = lVar10;
                }
              }
              else {
                if (((i[lVar7 + lVar2] <= uVar4) || (i[lVar8 + lVar2] <= uVar4)) ||
                   (i[lVar9 + lVar2] <= uVar4)) goto LAB_00351daf;
                bVar1 = i[lVar10 + lVar2];
                lVar20 = lVar11;
              }
            }
            else {
              if ((((i[lVar7 + lVar2] <= uVar4) || (i[lVar8 + lVar2] <= uVar4)) ||
                  (i[lVar9 + lVar2] <= uVar4)) || (i[lVar10 + lVar2] <= uVar4)) goto LAB_00351daf;
              bVar1 = i[lVar11 + lVar2];
              lVar20 = lVar12;
            }
joined_r0x0035030f:
            if (uVar4 < bVar1) {
LAB_00351690:
              uVar22 = (uint)i[lVar20 + lVar2];
LAB_00351694:
              if (uVar4 < uVar22) {
LAB_00351709:
                iVar28 = iVar27;
                iVar25 = iVar3;
              }
            }
          }
        }
        else if ((((int)(uint)i[lVar29 + lVar2] < (int)uVar22) && (i[lVar30 + lVar2] < uVar22)) &&
                (i[lVar31 + lVar2] < uVar22)) {
          if (i[lVar6 + lVar2] < uVar22) {
            if (i[lVar13 + lVar2] < uVar22) {
              if (uVar22 <= i[lVar14 + lVar2]) {
                if ((uVar22 <= i[lVar7 + lVar2]) || (uVar22 <= i[lVar8 + lVar2])) goto LAB_00351daf;
                bVar1 = i[lVar9 + lVar2];
                lVar18 = lVar10;
                goto joined_r0x00350390;
              }
              if (uVar22 <= i[lVar15 + lVar2]) {
                if (uVar22 <= i[lVar7 + lVar2]) goto LAB_00351daf;
                bVar1 = i[lVar8 + lVar2];
                lVar18 = lVar9;
                goto joined_r0x00350390;
              }
              if (uVar22 <= i[lVar16 + lVar2]) {
                bVar1 = i[lVar7 + lVar2];
                lVar18 = lVar8;
                goto joined_r0x00350390;
              }
              bVar1 = i[lVar33 + lVar2];
joined_r0x0034f8a1:
              if (bVar1 < uVar22) goto LAB_00351709;
            }
            else {
              if (((uVar22 <= i[lVar7 + lVar2]) || (uVar22 <= i[lVar8 + lVar2])) ||
                 (uVar22 <= i[lVar9 + lVar2])) goto LAB_00351daf;
              bVar1 = i[lVar10 + lVar2];
              lVar18 = lVar11;
joined_r0x00350390:
              if (uVar22 <= bVar1) goto LAB_00351daf;
            }
LAB_003516fd:
            uVar4 = (uint)i[lVar18 + lVar2];
LAB_00351701:
            if (uVar4 < uVar22) goto LAB_00351709;
          }
          else if (((i[lVar7 + lVar2] < uVar22) && (i[lVar8 + lVar2] < uVar22)) &&
                  ((i[lVar9 + lVar2] < uVar22 && (i[lVar10 + lVar2] < uVar22)))) {
            bVar1 = i[lVar11 + lVar2];
            lVar18 = lVar12;
            goto joined_r0x00350390;
          }
        }
LAB_00351daf:
      } while ((iVar25 != iVar28 + -1) &&
              (iVar3 = iVar25 + iVar28, iVar27 = iVar28, iVar25 != iVar28));
      piVar5[uVar32] = iVar25;
    }
  }
  return piVar5;
}

Assistant:

int* aom_fast9_score(const byte* i, int stride, const xy* corners, int num_corners, int b)
{
  int* scores = (int*)malloc(sizeof(int)* num_corners);
  int n;

  int pixel[16];
  if(!scores) return NULL;
  make_offsets(pixel, stride);

  for(n=0; n < num_corners; n++)
    scores[n] = fast9_corner_score(i + corners[n].y*stride + corners[n].x, pixel, b);

  return scores;
}